

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeMergeEngineFree(MergeEngine *pMerger)

{
  int *in_RDI;
  int i;
  undefined4 local_c;
  
  if (in_RDI != (int *)0x0) {
    for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
      vdbePmaReaderClear((PmaReader *)0x171d38);
    }
  }
  sqlite3_free((void *)0x171d51);
  return;
}

Assistant:

static void vdbeMergeEngineFree(MergeEngine *pMerger){
  int i;
  if( pMerger ){
    for(i=0; i<pMerger->nTree; i++){
      vdbePmaReaderClear(&pMerger->aReadr[i]);
    }
  }
  sqlite3_free(pMerger);
}